

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O3

int prsgargs(prscxdef *ctx,prsndef *n)

{
  int iVar1;
  
  if ((n->prsnnlf == 2) && (n->prsntyp == 0x33)) {
    iVar1 = prsgargs(ctx,(n->prsnv).prsnvn[1]);
    prsgexp(ctx,(n->prsnv).prsnvn[0]);
    iVar1 = iVar1 + 1;
  }
  else {
    prsgexp(ctx,n);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int prsgargs(prscxdef *ctx, prsndef *n)
{
    int cnt = 0;
    
    if (n->prsnnlf == 2 && n->prsntyp == TOKTRPAR)
    {
        cnt = prsgargs(ctx, n->prsnv.prsnvn[1]);
        prsgexp(ctx, n->prsnv.prsnvn[0]);
    }
    else
        prsgexp(ctx, n);
    
    return(cnt + 1);
}